

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_c8515::RemoveOffsetBPM_basic_Test::TestBody(RemoveOffsetBPM_basic_Test *this)

{
  void *pvVar1;
  long lVar2;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<unsigned_int> __l_02;
  initializer_list<unsigned_int> __l_03;
  initializer_list<unsigned_int> __l_04;
  initializer_list<unsigned_int> __l_05;
  initializer_list<unsigned_int> __l_06;
  initializer_list<unsigned_int> __l_07;
  initializer_list<unsigned_int> __l_08;
  initializer_list<unsigned_int> __l_09;
  initializer_list<unsigned_int> __l_10;
  initializer_list<unsigned_int> __l_11;
  initializer_list<unsigned_int> __l_12;
  initializer_list<unsigned_int> __l_13;
  Polynomial<uint32_t,_double> polynomial;
  BinaryPolynomialModel<unsigned_int,_double> bpm;
  undefined1 local_472;
  undefined1 local_471;
  undefined1 local_470;
  allocator_type local_46f;
  allocator_type local_46e;
  allocator_type local_46d;
  allocator_type local_46c;
  allocator_type local_46b;
  allocator_type local_46a;
  allocator_type local_469;
  allocator_type local_468;
  allocator_type local_467;
  allocator_type local_466;
  allocator_type local_465;
  allocator_type local_464;
  allocator_type local_463;
  allocator_type local_462;
  allocator_type local_461;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_460;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_448;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_430;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_418;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_400;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_3e8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_3d0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_3b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_3a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_388;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_370;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_358;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_340;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_328;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_310;
  uint local_2f8 [4];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_2e8;
  undefined1 *local_2d0;
  uint local_2c8 [8];
  undefined1 *local_2a8;
  uint local_2a0 [6];
  undefined1 *local_288;
  undefined4 local_280;
  undefined1 *local_27c;
  undefined4 local_274;
  _Hashtable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_270;
  undefined1 local_238 [56];
  undefined1 local_200 [32];
  undefined1 *local_1e0;
  undefined1 local_1d8 [24];
  size_type local_1c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1b8;
  size_t local_1a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_198;
  pointer local_180;
  undefined1 local_178 [24];
  pointer local_160;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_158;
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined8 local_100;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_f8;
  undefined8 local_e0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d8;
  undefined8 local_c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b8;
  undefined8 local_a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_98;
  undefined8 local_80;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  undefined8 local_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  undefined8 local_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  
  local_2f8[3] = 1;
  __l._M_len = 1;
  __l._M_array = local_2f8 + 3;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_310,__l,&local_461);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_238,&local_310);
  local_238._24_8_ = 0x3ff0000000000000;
  local_2f8[2] = 2;
  __l_00._M_len = 1;
  __l_00._M_array = local_2f8 + 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_328,__l_00,&local_462);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_238 + 0x20),&local_328);
  local_200._0_8_ = &DAT_4000000000000000;
  local_2f8[1] = 3;
  __l_01._M_len = 1;
  __l_01._M_array = local_2f8 + 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_340,__l_01,&local_463);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_200 + 8),&local_340);
  local_1e0 = &DAT_4008000000000000;
  local_2f8[0] = 4;
  __l_02._M_len = 1;
  __l_02._M_array = local_2f8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_358,__l_02,&local_464);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d8,&local_358);
  local_1c0 = 0x4010000000000000;
  local_2a8 = &DAT_200000001;
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)&local_2a8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_370,__l_03,&local_465);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_1b8,&local_370);
  local_1a0 = 0x4028000000000000;
  local_2c8[6] = 1;
  local_2c8[7] = 3;
  __l_04._M_len = 2;
  __l_04._M_array = local_2c8 + 6;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_388,__l_04,&local_466);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_198,&local_388);
  local_180 = (pointer)&DAT_402a000000000000;
  local_2c8[4] = 1;
  local_2c8[5] = 4;
  __l_05._M_len = 2;
  __l_05._M_array = local_2c8 + 4;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_3a0,__l_05,&local_467);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_178,&local_3a0);
  local_160 = (pointer)0x402c000000000000;
  local_2c8[2] = 2;
  local_2c8[3] = 3;
  __l_06._M_len = 2;
  __l_06._M_array = local_2c8 + 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_3b8,__l_06,&local_468);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_158,&local_3b8);
  local_140._0_8_ = (__buckets_ptr)0x4037000000000000;
  local_2c8[0] = 2;
  local_2c8[1] = 4;
  __l_07._M_len = 2;
  __l_07._M_array = local_2c8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_3d0,__l_07,&local_469);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_140 + 8),&local_3d0);
  local_120._0_8_ = 0x4038000000000000;
  local_2d0 = &DAT_400000003;
  __l_08._M_len = 2;
  __l_08._M_array = (iterator)&local_2d0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_3e8,__l_08,&local_46a);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_120 + 8),&local_3e8);
  local_100 = 0x4041000000000000;
  local_2e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_f8,&local_2e8);
  local_e0 = 0x4059000000000000;
  local_27c = &DAT_200000001;
  local_274 = 3;
  __l_09._M_len = 3;
  __l_09._M_array = (iterator)&local_27c;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_400,__l_09,&local_46b);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_d8,&local_400);
  local_c0 = 0x405ec00000000000;
  local_288 = &DAT_200000001;
  local_280 = 4;
  __l_10._M_len = 3;
  __l_10._M_array = (iterator)&local_288;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_418,__l_10,&local_46c);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_b8,&local_418);
  local_a0 = 0x405f000000000000;
  local_2a0[3] = 1;
  local_2a0[4] = 3;
  local_2a0[5] = 4;
  __l_11._M_len = 3;
  __l_11._M_array = local_2a0 + 3;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_430,__l_11,&local_46d);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_98,&local_430);
  local_80 = 0x4060c00000000000;
  local_2a0[0] = 2;
  local_2a0[1] = 3;
  local_2a0[2] = 4;
  __l_12._M_len = 3;
  __l_12._M_array = local_2a0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_448,__l_12,&local_46e);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_78,&local_448);
  local_60 = 0x406d400000000000;
  local_38 = &DAT_200000001;
  puStack_30 = &DAT_400000003;
  __l_13._M_len = 4;
  __l_13._M_array = (iterator)&local_38;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_460,__l_13,&local_46f);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_58,&local_460);
  local_40 = 0x4093480000000000;
  std::
  _Hashtable<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const,double>,std::allocator<std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const,double>>,std::__detail::_Select1st,std::equal_to<std::vector<unsigned_int,std::allocator<unsigned_int>>>,cimod::vector_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const,double>const*>
            ((_Hashtable<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const,double>,std::allocator<std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const,double>>,std::__detail::_Select1st,std::equal_to<std::vector<unsigned_int,std::allocator<unsigned_int>>>,cimod::vector_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&local_270,local_238,&local_38,0,&local_470,&local_471,&local_472);
  lVar2 = 0x200;
  do {
    pvVar1 = *(void **)(local_238 + lVar2 + -0x20);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)(local_238 + lVar2 + -0x10) - (long)pvVar1);
    }
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != 0);
  if (local_460.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_460.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_460.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_460.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_448.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_448.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_448.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_448.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_430.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_430.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_430.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_430.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_418.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_418.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_418.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_418.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_400.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_400.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_400.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_400.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_388.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_388.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_388.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_388.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_370.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_370.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_370.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_370.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_358.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_358.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_358.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_358.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_340.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_340.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_340.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_340.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_328.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_328.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_328.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_328.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_310.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_310.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_310.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_310.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  cimod::BinaryPolynomialModel<unsigned_int,_double>::BinaryPolynomialModel
            ((BinaryPolynomialModel<unsigned_int,_double> *)local_238,
             (Polynomial<unsigned_int,_double> *)&local_270,SPIN);
  cimod::BinaryPolynomialModel<unsigned_int,_double>::RemoveOffset
            ((BinaryPolynomialModel<unsigned_int,_double> *)local_238);
  StateTestBPMUINT((BinaryPolynomialModel<unsigned_int,_double> *)local_238);
  std::
  _Hashtable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_140);
  if ((pointer)local_158.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_158.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)(local_178 + 8));
  if (local_198.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    operator_delete(local_198.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish,
                    (long)local_180 -
                    (long)local_198.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_long>,_std::allocator<std::pair<const_unsigned_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_long>,_std::allocator<std::pair<const_unsigned_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)(local_1d8 + 0x10));
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_200);
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_238);
  std::
  _Hashtable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_270);
  return;
}

Assistant:

TEST(RemoveOffsetBPM, basic) {
   Polynomial<uint32_t, double> polynomial = {
      //linear biases
      {{1}, 1.0}, {{2}, 2.0}, {{3}, 3.0}, {{4}, 4.0},
      //quadratic biases
      {{1, 2}, 12.0}, {{1, 3}, 13.0}, {{1, 4}, 14.0},
      {{2, 3}, 23.0}, {{2, 4}, 24.0},
      {{3, 4}, 34.0},
      //To be removed
      {{}, 100},
      //polynomial biases
      {{1, 2, 3}, 123.0}, {{1, 2, 4}, 124.0}, {{1, 3, 4}, 134.0},
      {{2, 3, 4}, 234.0},
      {{1, 2, 3, 4}, 1234.0}
   };
   
   BinaryPolynomialModel<uint32_t, double> bpm(polynomial, Vartype::SPIN);
   
   bpm.RemoveOffset();
   
   StateTestBPMUINT(bpm);
}